

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O3

void __thiscall
slang::ast::CoverageBinSymbol::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>
          (CoverageBinSymbol *this,AlwaysFFVisitor *visitor)

{
  size_t sVar1;
  Expression *pEVar2;
  BinsSelectExpr *this_00;
  pointer psVar3;
  TransRangeList *rangeList;
  TransRangeList *this_01;
  long lVar4;
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *set;
  pointer psVar5;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar6;
  span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
  sVar7;
  
  pEVar2 = getIffExpr(this);
  if (pEVar2 != (Expression *)0x0) {
    Expression::
    visitExpression<slang::ast::Expression_const,only_assigned_on_reset::AlwaysFFVisitor&>
              (pEVar2,pEVar2,visitor);
  }
  pEVar2 = getNumberOfBinsExpr(this);
  if (pEVar2 != (Expression *)0x0) {
    Expression::
    visitExpression<slang::ast::Expression_const,only_assigned_on_reset::AlwaysFFVisitor&>
              (pEVar2,pEVar2,visitor);
  }
  pEVar2 = getSetCoverageExpr(this);
  if (pEVar2 != (Expression *)0x0) {
    Expression::
    visitExpression<slang::ast::Expression_const,only_assigned_on_reset::AlwaysFFVisitor&>
              (pEVar2,pEVar2,visitor);
  }
  pEVar2 = getWithExpr(this);
  if (pEVar2 != (Expression *)0x0) {
    Expression::
    visitExpression<slang::ast::Expression_const,only_assigned_on_reset::AlwaysFFVisitor&>
              (pEVar2,pEVar2,visitor);
  }
  this_00 = getCrossSelectExpr(this);
  if (this_00 != (BinsSelectExpr *)0x0) {
    BinsSelectExpr::visit<only_assigned_on_reset::AlwaysFFVisitor>(this_00,visitor);
  }
  sVar6 = getValues(this);
  if (sVar6._M_extent._M_extent_value._M_extent_value != 0) {
    lVar4 = 0;
    do {
      pEVar2 = *(Expression **)((long)sVar6._M_ptr + lVar4);
      Expression::
      visitExpression<slang::ast::Expression_const,only_assigned_on_reset::AlwaysFFVisitor&>
                (pEVar2,pEVar2,visitor);
      lVar4 = lVar4 + 8;
    } while (sVar6._M_extent._M_extent_value._M_extent_value << 3 != lVar4);
  }
  sVar7 = getTransList(this);
  psVar3 = sVar7._M_ptr;
  if (sVar7._M_extent._M_extent_value._M_extent_value != 0) {
    psVar5 = psVar3 + sVar7._M_extent._M_extent_value._M_extent_value;
    do {
      sVar1 = (psVar3->_M_extent)._M_extent_value;
      if (sVar1 != 0) {
        this_01 = psVar3->_M_ptr;
        lVar4 = sVar1 * 0x28;
        do {
          TransRangeList::visitExprs<only_assigned_on_reset::AlwaysFFVisitor&>(this_01,visitor);
          this_01 = this_01 + 1;
          lVar4 = lVar4 + -0x28;
        } while (lVar4 != 0);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar5);
  }
  return;
}

Assistant:

void CoverageBinSymbol::visitExprs(TVisitor&& visitor) const {
    if (auto expr = getIffExpr())
        expr->visit(visitor);
    if (auto expr = getNumberOfBinsExpr())
        expr->visit(visitor);
    if (auto expr = getSetCoverageExpr())
        expr->visit(visitor);
    if (auto expr = getWithExpr())
        expr->visit(visitor);
    if (auto expr = getCrossSelectExpr())
        expr->visit(visitor);

    for (auto val : getValues())
        val->visit(visitor);

    for (auto& set : getTransList()) {
        for (auto& rangeList : set)
            rangeList.visitExprs(visitor);
    }
}